

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyItemNum(Scl_Tree_t *p,Scl_Item_t *pRoot,char *pName)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  Scl_Item_t *pSVar7;
  int iVar8;
  int iVar9;
  
  uVar6 = pRoot->Child;
  iVar1 = p->nItems;
  if ((int)uVar6 < iVar1) {
    iVar9 = 0;
    if ((int)uVar6 < 0) {
      pSVar7 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar7 = p->pItems + uVar6;
    }
    if (pSVar7 != (Scl_Item_t *)0x0) {
      pcVar3 = p->pContents;
      iVar9 = 0;
      do {
        iVar4 = (pSVar7->Key).Beg;
        iVar8 = (pSVar7->Key).End - iVar4;
        iVar4 = strncmp(pcVar3 + iVar4,pName,(long)iVar8);
        uVar6 = 0;
        if (iVar4 == 0) {
          sVar5 = strlen(pName);
          uVar6 = (uint)(iVar8 == (int)sVar5);
        }
        uVar2 = pSVar7->Next;
        if (iVar1 <= (int)uVar2) goto LAB_003e352d;
        if ((int)uVar2 < 0) {
          pSVar7 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar7 = p->pItems + uVar2;
        }
        iVar9 = iVar9 + uVar6;
      } while (pSVar7 != (Scl_Item_t *)0x0);
    }
    return iVar9;
  }
LAB_003e352d:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyItemNum( Scl_Tree_t * p, Scl_Item_t * pRoot, char * pName )
{
    Scl_Item_t * pItem;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pRoot, pItem, pName )
        Counter++;
    return Counter;
}